

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_tweak_add
              (secp256k1_context *ctx,secp256k1_pubkey *output_pubkey,
              secp256k1_xonly_pubkey *internal_pubkey,uchar *tweak32)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  long in_RDI;
  secp256k1_ge pk;
  secp256k1_ge *in_stack_ffffffffffffff68;
  secp256k1_context *in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff88;
  secp256k1_ge *in_stack_ffffffffffffff90;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modules/extrakeys/main_impl.h"
            ,0x79,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  }
  else {
    memset(in_RSI,0,0x40);
    if (in_RDX == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    }
    else if (in_RCX == 0) {
      secp256k1_callback_call
                ((secp256k1_callback *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    }
    else {
      iVar1 = secp256k1_xonly_pubkey_load
                        (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                         (secp256k1_xonly_pubkey *)0x1078de);
      if ((iVar1 != 0) &&
         (iVar1 = secp256k1_ec_pubkey_tweak_add_helper
                            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88), iVar1 != 0)) {
        secp256k1_pubkey_save
                  ((secp256k1_pubkey *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_tweak_add(const secp256k1_context* ctx, secp256k1_pubkey *output_pubkey, const secp256k1_xonly_pubkey *internal_pubkey, const unsigned char *tweak32) {
    secp256k1_ge pk;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output_pubkey != NULL);
    memset(output_pubkey, 0, sizeof(*output_pubkey));
    ARG_CHECK(internal_pubkey != NULL);
    ARG_CHECK(tweak32 != NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, internal_pubkey)
        || !secp256k1_ec_pubkey_tweak_add_helper(&pk, tweak32)) {
        return 0;
    }
    secp256k1_pubkey_save(output_pubkey, &pk);
    return 1;
}